

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parsePrimaryExpression
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  Token closeBrace_00;
  Token systemIdentifier;
  Token literal_00;
  Token literal_01;
  Token literal_02;
  SourceRange range;
  Token closeParen_00;
  Token openBrace_00;
  Token openBrace_01;
  Token closeParen_01;
  Token apostrophe_00;
  Token openParen_00;
  Token openParen_01;
  Token signing_00;
  Token closeBrace_01;
  SourceLocation location;
  bool bVar1;
  LiteralExpressionSyntax *pLVar2;
  ExpressionSyntax *pEVar3;
  ParenthesizedExpressionSyntax *pPVar4;
  Info *pIVar5;
  EmptyQueueExpressionSyntax *pEVar6;
  StreamingConcatenationExpressionSyntax *pSVar7;
  ConcatenationExpressionSyntax *pCVar8;
  MultipleConcatenationExpressionSyntax *pMVar9;
  SignedCastExpressionSyntax *pSVar10;
  SystemNameSyntax *pSVar11;
  DataTypeSyntax *pDVar12;
  NameSyntax *pNVar13;
  AssignmentPatternExpressionSyntax *pAVar14;
  undefined4 in_ESI;
  long in_RDI;
  Token TVar15;
  Token in_stack_00000000;
  NameSyntax *name;
  bitmask<slang::parsing::detail::NameOptions> nameOptions;
  DataTypeSyntax *type;
  Parser *in_stack_000000b0;
  bitmask<slang::parsing::detail::TypeOptions> in_stack_000000bc;
  ParenthesizedExpressionSyntax *parenExpr;
  Token closeParen_1;
  ExpressionSyntax *innerExpr;
  Token openParen_1;
  Token apostrophe;
  Token signing;
  Token closeBrace;
  ConcatenationExpressionSyntax *concat;
  Token openBraceInner;
  ExpressionSyntax *first;
  Token openBrace;
  Token closeParen;
  ExpressionSyntax *expr;
  Token openParen;
  Token literal;
  TokenKind kind;
  DataTypeSyntax *in_stack_00000420;
  Parser *in_stack_00000428;
  undefined4 in_stack_fffffffffffffd38;
  SyntaxKind in_stack_fffffffffffffd3c;
  Parser *in_stack_fffffffffffffd40;
  undefined6 in_stack_fffffffffffffd48;
  TokenKind in_stack_fffffffffffffd4e;
  SourceLocation in_stack_fffffffffffffd50;
  undefined6 in_stack_fffffffffffffd58;
  undefined2 in_stack_fffffffffffffd5e;
  ParserBase *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  ParserBase *in_stack_fffffffffffffda0;
  bitmask<slang::parsing::detail::NameOptions> in_stack_fffffffffffffda8;
  bitmask<slang::parsing::detail::TypeOptions> in_stack_fffffffffffffdac;
  Parser *in_stack_fffffffffffffdb0;
  DiagCode code;
  bitmask<slang::parsing::detail::ExpressionOptions> options_00;
  undefined1 in_stack_fffffffffffffdb8 [16];
  undefined1 disallowVector;
  Parser *in_stack_fffffffffffffdc8;
  TokenKind TVar16;
  ParserBase *in_stack_fffffffffffffdd0;
  Parser *in_stack_fffffffffffffdd8;
  NumberParser *in_stack_fffffffffffffde0;
  Parser *local_188;
  undefined8 in_stack_fffffffffffffe88;
  Info *in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffef8 [16];
  bitmask<slang::parsing::detail::ExpressionOptions> local_ac;
  Token local_a8;
  bitmask<slang::parsing::detail::ExpressionOptions> local_98;
  underlying_type local_94;
  ExpressionSyntax *local_90;
  Token local_88;
  bitmask<slang::parsing::detail::ExpressionOptions> local_74;
  Token local_70;
  Token local_60;
  undefined8 local_50;
  Info *local_48;
  Token local_40;
  Token local_30;
  TokenKind local_1a;
  undefined4 in_stack_fffffffffffffff0;
  Parser *in_stack_fffffffffffffff8;
  
  local_30 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  options_00.m_bits = in_stack_fffffffffffffdb8._4_4_;
  local_1a = local_30.kind;
  if (local_30.kind == SystemIdentifier) {
    ParserBase::consume(in_stack_fffffffffffffd60);
    systemIdentifier.rawLen = in_stack_fffffffffffffd3c;
    systemIdentifier.kind = (short)in_stack_fffffffffffffd38;
    systemIdentifier._2_1_ = (char)((uint)in_stack_fffffffffffffd38 >> 0x10);
    systemIdentifier.numFlags.raw = (char)((uint)in_stack_fffffffffffffd38 >> 0x18);
    systemIdentifier.info = (Info *)in_stack_fffffffffffffd40;
    pSVar11 = slang::syntax::SyntaxFactory::systemName((SyntaxFactory *)0x5c05f5,systemIdentifier);
    return (ExpressionSyntax *)pSVar11;
  }
  if (local_30.kind != StringLiteral) {
    if ((ushort)(local_30.kind - IntegerLiteral) < 2) {
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_74,DisallowVectors);
      disallowVector = in_stack_fffffffffffffdb8[0xf];
      bitmask<slang::parsing::detail::ExpressionOptions>::has
                ((bitmask<slang::parsing::detail::ExpressionOptions> *)in_stack_fffffffffffffd40,
                 (bitmask<slang::parsing::detail::ExpressionOptions> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      pEVar3 = parseIntegerExpression(in_stack_fffffffffffffdc8,(bool)disallowVector);
      return pEVar3;
    }
    if (local_30.kind != UnbasedUnsizedLiteral) {
      if (local_30.kind == RealLiteral) {
        local_70 = NumberParser::parseReal<slang::parsing::Parser>
                             (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        literal_02.rawLen._2_2_ = in_stack_fffffffffffffd4e;
        literal_02._0_6_ = in_stack_fffffffffffffd48;
        literal_02.info = (Info *)in_stack_fffffffffffffd50;
        pLVar2 = slang::syntax::SyntaxFactory::literalExpression
                           ((SyntaxFactory *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                            literal_02);
        return (ExpressionSyntax *)pLVar2;
      }
      if (local_30.kind == TimeLiteral) {
        local_60 = NumberParser::parseReal<slang::parsing::Parser>
                             (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        literal_01.rawLen._2_2_ = in_stack_fffffffffffffd4e;
        literal_01._0_6_ = in_stack_fffffffffffffd48;
        literal_01.info = (Info *)in_stack_fffffffffffffd50;
        pLVar2 = slang::syntax::SyntaxFactory::literalExpression
                           ((SyntaxFactory *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                            literal_01);
        return (ExpressionSyntax *)pLVar2;
      }
      if (local_30.kind == ApostropheOpenBrace) {
        pAVar14 = parseAssignmentPatternExpression(in_stack_00000428,in_stack_00000420);
        return (ExpressionSyntax *)pAVar14;
      }
      if (local_30.kind == OpenBrace) {
        ParserBase::consume(in_stack_fffffffffffffd60);
        TVar16 = (TokenKind)((ulong)in_stack_fffffffffffffdc8 >> 0x30);
        TVar15 = ParserBase::peek((ParserBase *)
                                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        if (TVar15.kind == CloseBrace) {
          pIVar5 = (Info *)(in_RDI + 0xe0);
          ParserBase::consume(in_stack_fffffffffffffd60);
          openBrace_00.rawLen._2_2_ = in_stack_fffffffffffffd4e;
          openBrace_00._0_6_ = in_stack_fffffffffffffd48;
          openBrace_00.info = pIVar5;
          closeBrace_00.rawLen = in_stack_fffffffffffffd3c;
          closeBrace_00.kind = (short)in_stack_fffffffffffffd38;
          closeBrace_00._2_1_ = (char)((uint)in_stack_fffffffffffffd38 >> 0x10);
          closeBrace_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffd38 >> 0x18);
          closeBrace_00.info = (Info *)in_stack_fffffffffffffd40;
          pEVar6 = slang::syntax::SyntaxFactory::emptyQueueExpression
                             ((SyntaxFactory *)0x5c0246,openBrace_00,closeBrace_00);
          return (ExpressionSyntax *)pEVar6;
        }
        if (1 < (ushort)(TVar15.kind - LeftShift)) {
          parseExpression(in_stack_fffffffffffffd40);
          bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4e
                                  );
          if (!bVar1) {
            pCVar8 = parseConcatenation(in_stack_fffffffffffffff8,in_stack_00000000,
                                        (ExpressionSyntax *)
                                        CONCAT44(in_ESI,in_stack_fffffffffffffff0));
            return (ExpressionSyntax *)pCVar8;
          }
          ParserBase::consume(in_stack_fffffffffffffd60);
          parseConcatenation(in_stack_fffffffffffffff8,in_stack_00000000,
                             (ExpressionSyntax *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
          TVar15 = ParserBase::expect(in_stack_fffffffffffffdd0,TVar16);
          local_188 = TVar15._0_8_;
          openBrace_01.rawLen._2_2_ = in_stack_fffffffffffffd4e;
          openBrace_01._0_6_ = in_stack_fffffffffffffd48;
          openBrace_01.info = (Info *)in_stack_fffffffffffffd50;
          closeBrace_01.info._0_7_ = in_stack_fffffffffffffd68;
          closeBrace_01._0_8_ = in_stack_fffffffffffffd60;
          closeBrace_01.info._7_1_ = in_stack_fffffffffffffd6f;
          pMVar9 = slang::syntax::SyntaxFactory::multipleConcatenationExpression
                             ((SyntaxFactory *)TVar15.info,openBrace_01,
                              (ExpressionSyntax *)local_188,
                              (ConcatenationExpressionSyntax *)0x5c0416,closeBrace_01);
          return (ExpressionSyntax *)pMVar9;
        }
        TVar15.info = in_stack_fffffffffffffe90;
        TVar15.kind = (short)in_stack_fffffffffffffe88;
        TVar15._2_1_ = (char)((ulong)in_stack_fffffffffffffe88 >> 0x10);
        TVar15.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe88 >> 0x18);
        TVar15.rawLen = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        pSVar7 = parseStreamConcatenation(local_188,TVar15);
        return (ExpressionSyntax *)pSVar7;
      }
      if (local_30.kind == OpenParenthesis) {
        local_88 = ParserBase::consume(in_stack_fffffffffffffd60);
        TVar16 = (TokenKind)((ulong)in_stack_fffffffffffffdc8 >> 0x30);
        bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_98,AllowDist);
        local_94 = (underlying_type)
                   bitmask<slang::parsing::detail::ExpressionOptions>::operator&
                             ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                              CONCAT26(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48),
                              (bitmask<slang::parsing::detail::ExpressionOptions> *)
                              in_stack_fffffffffffffd40);
        local_90 = parseMinTypMaxExpression(in_stack_fffffffffffffdb0,options_00);
        code = SUB84((ulong)in_stack_fffffffffffffdb0 >> 0x20,0);
        local_a8 = ParserBase::expect(in_stack_fffffffffffffdd0,TVar16);
        bVar1 = false;
        if ((local_90->super_SyntaxNode).kind == ExpressionOrDist) {
          bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_ac,AllowDist);
          bVar1 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                            ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                             in_stack_fffffffffffffd40,
                             (bitmask<slang::parsing::detail::ExpressionOptions> *)
                             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        }
        if (bVar1 != false) {
          Token::location(&local_88);
          location._4_4_ = in_stack_fffffffffffffdac.m_bits;
          location._0_4_ = in_stack_fffffffffffffda8.m_bits;
          in_stack_fffffffffffffd60 =
               (ParserBase *)ParserBase::addDiag(in_stack_fffffffffffffda0,code,location);
          Token::range((Token *)in_stack_fffffffffffffd60);
          range.startLoc._6_2_ = in_stack_fffffffffffffd4e;
          range.startLoc._0_6_ = in_stack_fffffffffffffd48;
          range.endLoc = in_stack_fffffffffffffd50;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffd40,range);
        }
        openParen_00.rawLen._2_2_ = in_stack_fffffffffffffd5e;
        openParen_00._0_6_ = in_stack_fffffffffffffd58;
        openParen_00.info = (Info *)in_stack_fffffffffffffd60;
        closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffd4e;
        closeParen_00._0_6_ = in_stack_fffffffffffffd48;
        closeParen_00.info = (Info *)in_stack_fffffffffffffd50;
        pPVar4 = slang::syntax::SyntaxFactory::parenthesizedExpression
                           ((SyntaxFactory *)in_stack_fffffffffffffd40,openParen_00,
                            (ExpressionSyntax *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                            closeParen_00);
        return (ExpressionSyntax *)pPVar4;
      }
      if (local_30.kind != Dollar) {
        if (local_30.kind != ConstKeyword) {
          if (local_30.kind == NullKeyword) goto LAB_005bfe0b;
          if ((local_30.kind != SignedKeyword) && (local_30.kind != UnsignedKeyword)) {
            bVar1 = slang::syntax::SyntaxFacts::isPossibleDataType(local_30.kind);
            if ((bVar1) && ((local_1a != Identifier && (local_1a != UnitSystemName)))) {
              memset(&stack0xfffffffffffffdac,0,4);
              bitmask<slang::parsing::detail::TypeOptions>::bitmask
                        ((bitmask<slang::parsing::detail::TypeOptions> *)&stack0xfffffffffffffdac);
              pDVar12 = parseDataType(in_stack_000000b0,in_stack_000000bc);
              bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd50,
                                       in_stack_fffffffffffffd4e);
              if (!bVar1) {
                return &pDVar12->super_ExpressionSyntax;
              }
              pAVar14 = parseAssignmentPatternExpression(in_stack_00000428,in_stack_00000420);
              return (ExpressionSyntax *)pAVar14;
            }
            bitmask<slang::parsing::detail::NameOptions>::bitmask
                      ((bitmask<slang::parsing::detail::NameOptions> *)&stack0xfffffffffffffda8,
                       ExpectingExpression);
            bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
                      ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                       &stack0xfffffffffffffda4,SequenceExpr);
            bVar1 = bitmask<slang::parsing::detail::ExpressionOptions>::has
                              ((bitmask<slang::parsing::detail::ExpressionOptions> *)
                               in_stack_fffffffffffffd40,
                               (bitmask<slang::parsing::detail::ExpressionOptions> *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
            if (bVar1) {
              bitmask<slang::parsing::detail::NameOptions>::bitmask
                        ((bitmask<slang::parsing::detail::NameOptions> *)&stack0xfffffffffffffda0,
                         SequenceExpr);
              bitmask<slang::parsing::detail::NameOptions>::operator|=
                        ((bitmask<slang::parsing::detail::NameOptions> *)&stack0xfffffffffffffda8,
                         (bitmask<slang::parsing::detail::NameOptions> *)&stack0xfffffffffffffda0);
            }
            pNVar13 = parseName(in_stack_fffffffffffffef8._0_8_,
                                (bitmask<slang::parsing::detail::NameOptions>)
                                in_stack_fffffffffffffef8._12_4_);
            bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd50,
                                     in_stack_fffffffffffffd4e);
            if (!bVar1) {
              return &pNVar13->super_ExpressionSyntax;
            }
            slang::syntax::SyntaxFactory::namedType
                      ((SyntaxFactory *)in_stack_fffffffffffffd40,
                       (NameSyntax *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
            pAVar14 = parseAssignmentPatternExpression(in_stack_00000428,in_stack_00000420);
            return (ExpressionSyntax *)pAVar14;
          }
        }
        ParserBase::consume(in_stack_fffffffffffffd60);
        TVar16 = (TokenKind)((ulong)in_stack_fffffffffffffdc8 >> 0x30);
        ParserBase::expect(in_stack_fffffffffffffdd0,TVar16);
        ParserBase::expect(in_stack_fffffffffffffdd0,TVar16);
        parseExpression(in_stack_fffffffffffffd40);
        ParserBase::expect(in_stack_fffffffffffffdd0,TVar16);
        openParen_01.rawLen._2_2_ = in_stack_fffffffffffffd5e;
        openParen_01._0_6_ = in_stack_fffffffffffffd58;
        openParen_01.info = (Info *)in_stack_fffffffffffffd60;
        closeParen_01.rawLen._2_2_ = in_stack_fffffffffffffd4e;
        closeParen_01._0_6_ = in_stack_fffffffffffffd48;
        closeParen_01.info = (Info *)in_stack_fffffffffffffd50;
        slang::syntax::SyntaxFactory::parenthesizedExpression
                  ((SyntaxFactory *)in_stack_fffffffffffffd40,openParen_01,
                   (ExpressionSyntax *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                   ,closeParen_01);
        signing_00.rawLen._2_2_ = in_stack_fffffffffffffd5e;
        signing_00._0_6_ = in_stack_fffffffffffffd58;
        signing_00.info = (Info *)in_stack_fffffffffffffd60;
        apostrophe_00.rawLen._2_2_ = in_stack_fffffffffffffd4e;
        apostrophe_00._0_6_ = in_stack_fffffffffffffd48;
        apostrophe_00.info = (Info *)in_stack_fffffffffffffd50;
        pSVar10 = slang::syntax::SyntaxFactory::signedCastExpression
                            ((SyntaxFactory *)in_stack_fffffffffffffd40,signing_00,apostrophe_00,
                             (ParenthesizedExpressionSyntax *)
                             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        return &pSVar10->super_ExpressionSyntax;
      }
    }
  }
LAB_005bfe0b:
  local_40 = ParserBase::consume(in_stack_fffffffffffffd60);
  slang::syntax::SyntaxFacts::getLiteralExpression(local_40.kind);
  TVar15 = local_40;
  local_50._0_2_ = local_40.kind;
  local_50._2_1_ = local_40._2_1_;
  local_50._3_1_ = local_40.numFlags.raw;
  local_50._4_4_ = local_40.rawLen;
  local_40.info = TVar15.info;
  local_48 = local_40.info;
  literal_00.rawLen._2_2_ = in_stack_fffffffffffffd4e;
  literal_00._0_6_ = in_stack_fffffffffffffd48;
  literal_00.info = (Info *)in_stack_fffffffffffffd50;
  local_40 = TVar15;
  pLVar2 = slang::syntax::SyntaxFactory::literalExpression
                     ((SyntaxFactory *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                      literal_00);
  return (ExpressionSyntax *)pLVar2;
}

Assistant:

ExpressionSyntax& Parser::parsePrimaryExpression(bitmask<ExpressionOptions> options) {
    TokenKind kind = peek().kind;
    switch (kind) {
        case TokenKind::StringLiteral:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::NullKeyword:
        case TokenKind::Dollar: {
            auto literal = consume();
            return factory.literalExpression(getLiteralExpression(literal.kind), literal);
        }
        case TokenKind::TimeLiteral:
            return factory.literalExpression(SyntaxKind::TimeLiteralExpression,
                                             numberParser.parseReal(*this));
        case TokenKind::RealLiteral:
            return factory.literalExpression(SyntaxKind::RealLiteralExpression,
                                             numberParser.parseReal(*this));
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
            return parseIntegerExpression(options.has(ExpressionOptions::DisallowVectors));
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto expr = &parseMinTypMaxExpression(options & ExpressionOptions::AllowDist);
            auto closeParen = expect(TokenKind::CloseParenthesis);

            if (expr->kind == SyntaxKind::ExpressionOrDist &&
                options.has(ExpressionOptions::AllowDist)) {
                addDiag(diag::NonstandardDist, openParen.location()) << closeParen.range();
            }

            return factory.parenthesizedExpression(openParen, *expr, closeParen);
        }
        case TokenKind::ApostropheOpenBrace:
            return parseAssignmentPatternExpression(nullptr);
        case TokenKind::OpenBrace: {
            // several different things this could be:
            // 1. empty queue expression { }
            // 2. streaming concatenation {>> {expr}}
            // 3. multiple concatenation {expr {concat}}
            // 4. concatenation {expr, expr}
            auto openBrace = consume();
            switch (peek().kind) {
                case TokenKind::CloseBrace:
                    return factory.emptyQueueExpression(openBrace, consume());
                case TokenKind::LeftShift:
                case TokenKind::RightShift:
                    return parseStreamConcatenation(openBrace);
                default: {
                    auto& first = parseExpression();
                    if (!peek(TokenKind::OpenBrace))
                        return parseConcatenation(openBrace, &first);
                    else {
                        auto openBraceInner = consume();
                        auto& concat = parseConcatenation(openBraceInner, nullptr);
                        auto closeBrace = expect(TokenKind::CloseBrace);
                        return factory.multipleConcatenationExpression(openBrace, first, concat,
                                                                       closeBrace);
                    }
                }
            }
        }
        case TokenKind::SignedKeyword:
        case TokenKind::UnsignedKeyword:
        case TokenKind::ConstKeyword: {
            auto signing = consume();
            auto apostrophe = expect(TokenKind::Apostrophe);
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& innerExpr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& parenExpr = factory.parenthesizedExpression(openParen, innerExpr, closeParen);
            return factory.signedCastExpression(signing, apostrophe, parenExpr);
        }
        case TokenKind::SystemIdentifier:
            return factory.systemName(consume());
        default:
            // possibilities here:
            // 1. data type
            // 2. qualified name
            // 3. implicit class handles
            // 4. any of [1-3] with an assignment pattern
            // 5. any of [1-3] with a cast expression
            // 6. error
            if (isPossibleDataType(kind) && kind != TokenKind::Identifier &&
                kind != TokenKind::UnitSystemName) {

                auto& type = parseDataType();
                if (peek(TokenKind::ApostropheOpenBrace))
                    return parseAssignmentPatternExpression(&type);
                else
                    return type;
            }
            else {
                bitmask<NameOptions> nameOptions = NameOptions::ExpectingExpression;
                if (options.has(ExpressionOptions::SequenceExpr))
                    nameOptions |= NameOptions::SequenceExpr;

                // parseName() will insert a missing identifier token for the error case
                auto& name = parseName(nameOptions);
                if (peek(TokenKind::ApostropheOpenBrace))
                    return parseAssignmentPatternExpression(&factory.namedType(name));
                else {
                    // otherwise just a name expression
                    return name;
                }
            }
    }
}